

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O2

NFRule * __thiscall icu_63::NFRuleSet::findNormalRule(NFRuleSet *this,int64_t number)

{
  NFRule **ppNVar1;
  long lVar2;
  UBool UVar3;
  NFRule *pNVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  if (this->fIsFractionRuleSet != '\0') {
    pNVar4 = findFractionRuleSetRule(this,(double)number);
    return pNVar4;
  }
  if (number < 0) {
    if (this->nonNumericalRules[0] != (NFRule *)0x0) {
      return this->nonNumericalRules[0];
    }
    number = -number;
  }
  uVar5 = (this->rules).fCount;
  if ((int)uVar5 < 1) {
    return this->nonNumericalRules[3];
  }
  ppNVar1 = (this->rules).fStuff;
  iVar6 = 0;
  while (uVar7 = uVar5, iVar6 < (int)uVar7) {
    uVar5 = iVar6 + uVar7 >> 1;
    pNVar4 = ppNVar1[uVar5];
    lVar2 = pNVar4->baseValue;
    if (lVar2 == number) {
      return pNVar4;
    }
    if (lVar2 <= number) {
      iVar6 = uVar5 + 1;
      uVar5 = uVar7;
    }
  }
  if (uVar7 != 0) {
    pNVar4 = ppNVar1[uVar7 - 1];
    UVar3 = NFRule::shouldRollBack(pNVar4,number);
    if (UVar3 == '\0') {
      return pNVar4;
    }
    if ((uVar7 != 1) && (ppNVar1 = (this->rules).fStuff, ppNVar1 != (NFRule **)0x0)) {
      return ppNVar1[uVar7 - 2];
    }
  }
  return (NFRule *)0x0;
}

Assistant:

const NFRule *
NFRuleSet::findNormalRule(int64_t number) const
{
    // if this is a fraction rule set, use findFractionRuleSetRule()
    // to find the rule (we should only go into this clause if the
    // value is 0)
    if (fIsFractionRuleSet) {
        return findFractionRuleSetRule((double)number);
    }

    // if the number is negative, return the negative-number rule
    // (if there isn't one, pretend the number is positive)
    if (number < 0) {
        if (nonNumericalRules[NEGATIVE_RULE_INDEX]) {
            return nonNumericalRules[NEGATIVE_RULE_INDEX];
        } else {
            number = -number;
        }
    }

    // we have to repeat the preceding two checks, even though we
    // do them in findRule(), because the version of format() that
    // takes a long bypasses findRule() and goes straight to this
    // function.  This function does skip the fraction rules since
    // we know the value is an integer (it also skips the master
    // rule, since it's considered a fraction rule.  Skipping the
    // master rule in this function is also how we avoid infinite
    // recursion)

    // {dlf} unfortunately this fails if there are no rules except
    // special rules.  If there are no rules, use the master rule.

    // binary-search the rule list for the applicable rule
    // (a rule is used for all values from its base value to
    // the next rule's base value)
    int32_t hi = rules.size();
    if (hi > 0) {
        int32_t lo = 0;

        while (lo < hi) {
            int32_t mid = (lo + hi) / 2;
            if (rules[mid]->getBaseValue() == number) {
                return rules[mid];
            }
            else if (rules[mid]->getBaseValue() > number) {
                hi = mid;
            }
            else {
                lo = mid + 1;
            }
        }
        if (hi == 0) { // bad rule set, minimum base > 0
            return NULL; // want to throw exception here
        }

        NFRule *result = rules[hi - 1];

        // use shouldRollBack() to see whether we need to invoke the
        // rollback rule (see shouldRollBack()'s documentation for
        // an explanation of the rollback rule).  If we do, roll back
        // one rule and return that one instead of the one we'd normally
        // return
        if (result->shouldRollBack(number)) {
            if (hi == 1) { // bad rule set, no prior rule to rollback to from this base
                return NULL;
            }
            result = rules[hi - 2];
        }
        return result;
    }
    // else use the master rule
    return nonNumericalRules[MASTER_RULE_INDEX];
}